

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_file_size(char *file,wchar_t line,char *pathname,long size)

{
  undefined1 local_d0 [8];
  stat st;
  wchar_t r;
  int64_t filesize;
  long size_local;
  char *pathname_local;
  wchar_t line_local;
  char *file_local;
  
  assertion_count(file,line);
  st.__glibc_reserved[2]._4_4_ = lstat(pathname,(stat *)local_d0);
  if ((st.__glibc_reserved[2]._4_4_ == 0) && (st.st_rdev == size)) {
    file_local._4_4_ = L'\x01';
  }
  else {
    failure_start(file,line,"File %s has size %ld, expected %ld",pathname,st.st_rdev,size);
    failure_finish((void *)0x0);
    file_local._4_4_ = L'\0';
  }
  return file_local._4_4_;
}

Assistant:

int
assertion_file_size(const char *file, int line, const char *pathname, long size)
{
	int64_t filesize;
	int r;

	assertion_count(file, line);
#if defined(_WIN32) && !defined(__CYGWIN__)
	{
		BY_HANDLE_FILE_INFORMATION bhfi;
		r = !my_GetFileInformationByName(pathname, &bhfi);
		filesize = ((int64_t)bhfi.nFileSizeHigh << 32) + bhfi.nFileSizeLow;
	}
#else
	{
		struct stat st;
		r = lstat(pathname, &st);
		filesize = st.st_size;
	}
#endif
	if (r == 0 && filesize == size)
			return (1);
	failure_start(file, line, "File %s has size %ld, expected %ld",
	    pathname, (long)filesize, (long)size);
	failure_finish(NULL);
	return (0);
}